

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

bool __thiscall
tetgenmesh::formcavity
          (tetgenmesh *this,triface *searchtet,arraypool *missingshs,arraypool *crosstets,
          arraypool *topfaces,arraypool *botfaces,arraypool *toppoints,arraypool *botpoints)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  triface *t;
  point pdVar7;
  point pdVar8;
  point pdVar9;
  unsigned_long uVar10;
  uint local_d8;
  int local_d4;
  int k;
  int j;
  int i;
  int t1ver;
  int poss [4];
  int types [2];
  int intflag;
  bool invalidflag;
  bool testflag;
  point *parypt;
  point pe;
  point pd;
  point pa;
  face *parysh;
  triface *parytet;
  triface chkface;
  triface neightet;
  triface spintet;
  arraypool *crossedges;
  arraypool *botfaces_local;
  arraypool *topfaces_local;
  arraypool *crosstets_local;
  arraypool *missingshs_local;
  triface *searchtet_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&neightet.ver);
  triface::triface((triface *)&chkface.ver);
  triface::triface((triface *)&parytet);
  pa = (point)0x0;
  if (2 < this->b->verbose) {
    printf("      Form the cavity of a missing region.\n");
  }
  markedge(this,searchtet);
  arraypool::newindex(topfaces,&parysh);
  triface::operator=((triface *)parysh,searchtet);
  bVar6 = false;
  k = 0;
  do {
    bVar4 = false;
    if ((long)k < topfaces->objects) {
      bVar4 = (bool)(bVar6 ^ 1);
    }
    if (!bVar4) {
      for (k = 0; (long)k < topfaces->objects; k = k + 1) {
        unmarkedge(this,(triface *)
                        (topfaces->toparray[k >> ((byte)topfaces->log2objectsperblock & 0x1f)] +
                        (k & topfaces->objectsperblockmark) * topfaces->objectbytes));
      }
      arraypool::restart(topfaces);
      if (bVar6) {
        for (k = 0; (long)k < crosstets->objects; k = k + 1) {
          uninfect(this,(triface *)
                        (crosstets->toparray[k >> ((byte)crosstets->log2objectsperblock & 0x1f)] +
                        (k & crosstets->objectsperblockmark) * crosstets->objectbytes));
        }
        for (k = 0; (long)k < botpoints->objects; k = k + 1) {
          _intflag = botpoints->toparray[k >> ((byte)botpoints->log2objectsperblock & 0x1f)] +
                     (k & botpoints->objectsperblockmark) * botpoints->objectbytes;
          puninfect(this,*(point *)_intflag);
        }
        for (k = 0; (long)k < toppoints->objects; k = k + 1) {
          _intflag = toppoints->toparray[k >> ((byte)toppoints->log2objectsperblock & 0x1f)] +
                     (k & toppoints->objectsperblockmark) * toppoints->objectbytes;
          puninfect(this,*(point *)_intflag);
        }
        arraypool::restart(crosstets);
        arraypool::restart(botpoints);
        arraypool::restart(toppoints);
        uVar10 = randomnation(this,(int)missingshs->objects - 1);
        face::operator=(&this->recentsh,
                        (face *)(missingshs->toparray
                                 [(int)(uint)uVar10 >>
                                  ((byte)missingshs->log2objectsperblock & 0x1f)] +
                                (int)(((uint)uVar10 & missingshs->objectsperblockmark) *
                                     missingshs->objectbytes)));
        this_local._7_1_ = false;
      }
      else {
        if (2 < this->b->verbose) {
          printf("      Formed cavity: %ld (%ld) cross tets (edges).\n",crosstets->objects,
                 topfaces->objects);
        }
        for (k = 0; (long)k < crosstets->objects; k = k + 1) {
          pcVar3 = crosstets->toparray[k >> ((byte)crosstets->log2objectsperblock & 0x1f)];
          uVar1 = crosstets->objectsperblockmark;
          iVar2 = crosstets->objectbytes;
          eorgoppo(this,(triface *)(pcVar3 + (int)((k & uVar1) * iVar2)),(triface *)&neightet.ver);
          fsym(this,(triface *)&neightet.ver,(triface *)&chkface.ver);
          bVar6 = infected(this,(triface *)&chkface.ver);
          if (!bVar6) {
            arraypool::newindex(topfaces,&parysh);
            triface::operator=((triface *)parysh,(triface *)&chkface.ver);
          }
          edestoppo(this,(triface *)(pcVar3 + (int)((k & uVar1) * iVar2)),(triface *)&neightet.ver);
          fsym(this,(triface *)&neightet.ver,(triface *)&chkface.ver);
          bVar6 = infected(this,(triface *)&chkface.ver);
          if (!bVar6) {
            arraypool::newindex(botfaces,&parysh);
            triface::operator=((triface *)parysh,(triface *)&chkface.ver);
          }
          pd = org(this,(triface *)&chkface.ver);
          bVar6 = pinfected(this,pd);
          if ((!bVar6) && (pd != this->dummypoint)) {
            pinfect(this,pd);
            arraypool::newindex(botpoints,(void **)&intflag);
            *(point *)_intflag = pd;
            arraypool::newindex(toppoints,(void **)&intflag);
            *(point *)_intflag = pd;
          }
          pd = dest(this,(triface *)&chkface.ver);
          bVar6 = pinfected(this,pd);
          if ((!bVar6) && (pd != this->dummypoint)) {
            pinfect(this,pd);
            arraypool::newindex(botpoints,(void **)&intflag);
            *(point *)_intflag = pd;
            arraypool::newindex(toppoints,(void **)&intflag);
            *(point *)_intflag = pd;
          }
        }
        for (k = 0; (long)k < toppoints->objects; k = k + 1) {
          _intflag = toppoints->toparray[k >> ((byte)toppoints->log2objectsperblock & 0x1f)] +
                     (k & toppoints->objectsperblockmark) * toppoints->objectbytes;
          puninfect(this,*(point *)_intflag);
        }
        for (k = 0; (long)k < botpoints->objects; k = k + 1) {
          _intflag = botpoints->toparray[k >> ((byte)botpoints->log2objectsperblock & 0x1f)] +
                     (k & botpoints->objectsperblockmark) * botpoints->objectbytes;
          puninfect(this,*(point *)_intflag);
        }
        this->cavitycount = this->cavitycount + 1;
        this_local._7_1_ = true;
      }
      return this_local._7_1_;
    }
    t = (triface *)
        (topfaces->toparray[k >> ((byte)topfaces->log2objectsperblock & 0x1f)] +
        (k & topfaces->objectsperblockmark) * topfaces->objectbytes);
    pe = org(this,t);
    bVar4 = pinfected(this,pe);
    if (!bVar4) {
      pinfect(this,pe);
      arraypool::newindex(botpoints,(void **)&intflag);
      *(point *)_intflag = pe;
    }
    parypt = (point *)dest(this,t);
    bVar4 = pinfected(this,(point)parypt);
    if (!bVar4) {
      pinfect(this,(point)parypt);
      arraypool::newindex(toppoints,(void **)&intflag);
      *(point **)_intflag = parypt;
    }
    triface::operator=((triface *)&neightet.ver,t);
    do {
      bVar4 = infected(this,(triface *)&neightet.ver);
      if (!bVar4) {
        infect(this,(triface *)&neightet.ver);
        arraypool::newindex(crosstets,&parysh);
        triface::operator=((triface *)parysh,(triface *)&neightet.ver);
      }
      decode(this,*(tetrahedron *)(neightet._8_8_ + (long)facepivot1[(int)spintet.tet] * 8),
             (triface *)&neightet.ver);
      spintet.tet._0_4_ = facepivot2[(int)spintet.tet][(int)spintet.tet];
    } while ((tetrahedron *)neightet._8_8_ != t->tet);
    triface::operator=((triface *)&neightet.ver,t);
    do {
      pd = apex(this,(triface *)&neightet.ver);
      if ((pd != this->dummypoint) && (bVar4 = pmarktested(this,pd), !bVar4)) {
        bVar4 = true;
        local_d4 = 0;
        while( true ) {
          bVar5 = false;
          if (local_d4 < 2) {
            bVar5 = bVar4;
          }
          if (!bVar5) break;
          if (local_d4 == 0) {
            enext(this,(triface *)&neightet.ver,(triface *)&chkface.ver);
          }
          else {
            eprev(this,(triface *)&neightet.ver,(triface *)&chkface.ver);
          }
          do {
            bVar5 = edgemarked(this,(triface *)&chkface.ver);
            iVar2 = (int)neightet.tet;
            if (bVar5) {
              bVar4 = false;
              break;
            }
            decode(this,*(tetrahedron *)(chkface._8_8_ + (long)facepivot1[(int)neightet.tet] * 8),
                   (triface *)&chkface.ver);
            neightet.tet._0_4_ = facepivot2[iVar2][(int)neightet.tet];
          } while (chkface._8_8_ != neightet._8_8_);
          local_d4 = local_d4 + 1;
        }
        if (bVar4) {
          pe = org(this,(triface *)&neightet.ver);
          parypt = (point *)dest(this,(triface *)&neightet.ver);
          for (local_d8 = 0; (long)(int)local_d8 < missingshs->objects; local_d8 = local_d8 + 1) {
            pa = (point)(missingshs->toparray
                         [(int)local_d8 >> ((byte)missingshs->log2objectsperblock & 0x1f)] +
                        (int)((local_d8 & missingshs->objectsperblockmark) * missingshs->objectbytes
                             ));
            pdVar7 = sorg(this,(face *)pa);
            pdVar8 = sdest(this,(face *)pa);
            pdVar9 = sapex(this,(face *)pa);
            types[0] = tri_edge_test(this,pdVar7,pdVar8,pdVar9,(point)parypt,pd,(point)0x0,1,
                                     poss + 2,&i);
            if (0 < types[0]) {
              if (types[0] == 2) {
                enext(this,(triface *)&neightet.ver,(triface *)&chkface.ver);
                if ((poss[2] != 9) && (poss[2] != 8)) {
                  bVar6 = true;
                }
              }
              else {
                bVar6 = true;
              }
              break;
            }
            pdVar7 = sorg(this,(face *)pa);
            pdVar8 = sdest(this,(face *)pa);
            pdVar9 = sapex(this,(face *)pa);
            types[0] = tri_edge_test(this,pdVar7,pdVar8,pdVar9,pd,pe,(point)0x0,1,poss + 2,&i);
            if (0 < types[0]) {
              if (types[0] == 2) {
                eprev(this,(triface *)&neightet.ver,(triface *)&chkface.ver);
                if ((poss[2] != 9) && (poss[2] != 8)) {
                  bVar6 = true;
                }
              }
              else {
                bVar6 = true;
              }
              break;
            }
          }
          if (missingshs->objects <= (long)(int)local_d8) {
            bVar6 = true;
            break;
          }
          if (bVar6) break;
          esymself(this,(triface *)&chkface.ver);
          if ((*(long *)(chkface._8_8_ + 0x40) != 0) &&
             (*(long *)(*(long *)(chkface._8_8_ + 0x40) + (long)ver2edge[(int)neightet.tet] * 8) !=
              0)) {
            pdVar7 = sorg(this,(face *)pa);
            pdVar8 = sdest(this,(face *)pa);
            pdVar9 = sapex(this,(face *)pa);
            report_selfint_face(this,pdVar7,pdVar8,pdVar9,(face *)pa,(triface *)&chkface.ver,
                                types[0],poss + 2,&i);
          }
          triface::operator=((triface *)&parytet,(triface *)&chkface.ver);
          do {
            uVar1 = (uint)chkface.tet;
            if ((*(long *)&parytet[4].ver != 0) &&
               (*(long *)(*(long *)&parytet[4].ver + (long)(int)((uint)chkface.tet & 3) * 8) != 0))
            break;
            decode(this,(tetrahedron)(&parytet->tet)[(int)((uint)chkface.tet & 3)],
                   (triface *)&parytet);
            chkface.tet._0_4_ = fsymtbl[(int)uVar1][(int)(uint)chkface.tet];
          } while (parytet != (triface *)chkface._8_8_);
          if ((*(long *)&parytet[4].ver != 0) &&
             (*(long *)(*(long *)&parytet[4].ver + (long)(int)((uint)chkface.tet & 3) * 8) != 0)) {
            pdVar7 = sorg(this,(face *)pa);
            pdVar8 = sdest(this,(face *)pa);
            pdVar9 = sapex(this,(face *)pa);
            report_selfint_face(this,pdVar7,pdVar8,pdVar9,(face *)pa,(triface *)&parytet,types[0],
                                poss + 2,&i);
          }
          markedge(this,(triface *)&chkface.ver);
          arraypool::newindex(topfaces,&parysh);
          triface::operator=((triface *)parysh,(triface *)&chkface.ver);
        }
      }
      decode(this,*(tetrahedron *)(neightet._8_8_ + (long)facepivot1[(int)spintet.tet] * 8),
             (triface *)&neightet.ver);
      spintet.tet._0_4_ = facepivot2[(int)spintet.tet][(int)spintet.tet];
    } while ((tetrahedron *)neightet._8_8_ != t->tet);
    k = k + 1;
  } while( true );
}

Assistant:

bool tetgenmesh::formcavity(triface* searchtet, arraypool* missingshs,
                            arraypool* crosstets, arraypool* topfaces, 
                            arraypool* botfaces, arraypool* toppoints, 
                            arraypool* botpoints)
{
  arraypool *crossedges;
  triface spintet, neightet, chkface, *parytet;
  face *parysh = NULL;
  point pa, pd, pe, *parypt;
  bool testflag, invalidflag;
  int intflag, types[2], poss[4];
  int t1ver;
  int i, j, k;

  // Temporarily re-use 'topfaces' for all crossing edges.
  crossedges = topfaces;

  if (b->verbose > 2) {
    printf("      Form the cavity of a missing region.\n"); 
  }
  // Mark this edge to avoid testing it later.
  markedge(*searchtet);
  crossedges->newindex((void **) &parytet);
  *parytet = *searchtet;

  invalidflag = 0; 
  // Collect all crossing tets.  Each cross tet is saved in the standard
  //   form [d,e,#,#], where [d,e] is a crossing edge, d lies below R.
  //   NEITHER d NOR e is a vertex of R (!pmarktested). 
  for (i = 0; i < crossedges->objects && !invalidflag; i++) {
    // Get a crossing edge [d,e,#,#].
    searchtet = (triface *) fastlookup(crossedges, i);
    // Sort vertices into the bottom and top arrays.
    pd = org(*searchtet);
    if (!pinfected(pd)) {
      pinfect(pd);
      botpoints->newindex((void **) &parypt);
      *parypt = pd;
    }
    pe = dest(*searchtet);
    if (!pinfected(pe)) {
      pinfect(pe);
      toppoints->newindex((void **) &parypt);
      *parypt = pe;
    }

    // All tets sharing this edge are crossing tets.
    spintet = *searchtet;
    while (1) {
      if (!infected(spintet)) {
        infect(spintet);
        crosstets->newindex((void **) &parytet);
        *parytet = spintet;
      }
      // Go to the next crossing tet.
      fnextself(spintet);
      if (spintet.tet == searchtet->tet) break;
    } // while (1)

    // Detect new crossing edges.
    spintet = *searchtet;
    while (1) {
      // spintet is [d,e,a,#], where d lies below R, and e lies above R. 
      pa = apex(spintet);
      if (pa != dummypoint) {
        if (!pmarktested(pa)) {
	      // There exists a crossing edge, either [e,a] or [a,d]. First check
          //   if the crossing edge has already be added, i.e.,to check if one
		  //   of the tetrahedron at this edge has been marked.
          testflag = true;
          for (j = 0; j < 2 && testflag; j++) {
            if (j == 0) {
              enext(spintet, neightet);
            } else {
              eprev(spintet, neightet);
            }
            while (1) {
              if (edgemarked(neightet)) {
                // This crossing edge has already been tested. Skip it.
                testflag = false;
                break;
              }
              fnextself(neightet);
              if (neightet.tet == spintet.tet) break;
            }
          } // j
          if (testflag) {
            // Test if [e,a] or [a,d] intersects R.
            // Do a brute-force search in the set of subfaces of R. Slow!
            //   Need to be improved!
            pd = org(spintet);
            pe = dest(spintet);
            for (k = 0; k < missingshs->objects; k++) {
              parysh = (face *) fastlookup(missingshs, k);
              intflag = tri_edge_test(sorg(*parysh), sdest(*parysh), 
                          sapex(*parysh), pe, pa, NULL, 1, types, poss);
              if (intflag > 0) {
                // Found intersection. 'a' lies below R.
				if (intflag == 2) {
                  enext(spintet, neightet);
				  if ((types[0] == (int) ACROSSFACE) || 
                      (types[0] == (int) ACROSSEDGE)) {
                    // Only this case is valid.
                  } else {
                    // A non-valid intersection. Maybe a PLC problem.
                    invalidflag = 1;
                  }
				} else {
				  // Coplanar intersection. Maybe a PLC problem.
				  invalidflag = 1;
				}
                break;
              }
              intflag = tri_edge_test(sorg(*parysh), sdest(*parysh), 
			              sapex(*parysh), pa, pd, NULL, 1, types, poss);
              if (intflag > 0) {
                // Found intersection. 'a' lies above R.
				if (intflag == 2) {
                  eprev(spintet, neightet);
				  if ((types[0] == (int) ACROSSFACE) || 
                      (types[0] == (int) ACROSSEDGE)) {
					// Only this case is valid.
                  } else {
				    // A non-valid intersection. Maybe a PLC problem.
                    invalidflag = 1;
                  }
				} else {
				  // Coplanar intersection. Maybe a PLC problem.
				  invalidflag = 1;
				}
                break;
              }
            } // k
            if (k < missingshs->objects) {
              // Found a pair of triangle - edge intersection.
              if (invalidflag) {
                break; // the while (1) loop
              }
              // Adjust the edge direction, so that its origin lies below R,
              //   and its destination lies above R.
              esymself(neightet);
              // This edge may be a segment.
              if (issubseg(neightet)) {
				report_selfint_face(sorg(*parysh), sdest(*parysh), 
                  sapex(*parysh),parysh,&neightet,intflag,types,poss);
              }
			  // Check if it is an edge of a subface.
			  chkface = neightet;
              while (1) {
                if (issubface(chkface)) break;
                fsymself(chkface);
                if (chkface.tet == neightet.tet) break;
              }
              if (issubface(chkface)) {
                // Two subfaces are intersecting.
                report_selfint_face(sorg(*parysh), sdest(*parysh), 
                  sapex(*parysh),parysh,&chkface,intflag,types,poss);
              }
			  
              // Mark this edge to avoid testing it again.
              markedge(neightet);
              crossedges->newindex((void **) &parytet);
              *parytet = neightet;            
            } else {
              // No intersection is found. It may be a PLC problem.
              invalidflag = 1;
              break; // the while (1) loop
            } // if (k == missingshs->objects)
          } // if (testflag)
	    } 
      } // if (pa != dummypoint)
      // Go to the next crossing tet.
      fnextself(spintet);
      if (spintet.tet == searchtet->tet) break;
    } // while (1)
  } // i

  // Unmark all marked edges.
  for (i = 0; i < crossedges->objects; i++) {
    searchtet = (triface *) fastlookup(crossedges, i);
    unmarkedge(*searchtet);
  }
  crossedges->restart();


  if (invalidflag) {
    // Unmark all collected tets.
    for (i = 0; i < crosstets->objects; i++) {
      searchtet = (triface *) fastlookup(crosstets, i);
      uninfect(*searchtet);
    }
    // Unmark all collected vertices.
    for (i = 0; i < botpoints->objects; i++) {
      parypt = (point *) fastlookup(botpoints, i);
      puninfect(*parypt);
    }
    for (i = 0; i < toppoints->objects; i++) {
      parypt = (point *) fastlookup(toppoints, i);
      puninfect(*parypt);
    }
    crosstets->restart();
    botpoints->restart();
    toppoints->restart();

    // Randomly split an interior edge of R.
    i = randomnation(missingshs->objects - 1);
    recentsh = * (face *) fastlookup(missingshs, i);
    return false;
  }

  if (b->verbose > 2) {
    printf("      Formed cavity: %ld (%ld) cross tets (edges).\n", 
           crosstets->objects, crossedges->objects);
  }

  // Collect the top and bottom faces and the middle vertices. Since all top
  //   and bottom vertices have been infected. Uninfected vertices must be
  //   middle vertices (i.e., the vertices of R).
  // NOTE 1: Hull tets may be collected. Process them as a normal one.
  // NOTE 2: Some previously recovered subfaces may be completely inside the
  //   cavity. In such case, we remove these subfaces from the cavity and put
  //   them into 'subfacstack'. They will be recovered later.
  // NOTE 3: Some segments may be completely inside the cavity, e.g., they
  //   attached to a subface which is inside the cavity. Such segments are
  //   put in 'subsegstack'. They will be recovered later. 
  // NOTE4 : The interior subfaces and segments mentioned in NOTE 2 and 3
  //   are identified in the routine "carvecavity()". 

  for (i = 0; i < crosstets->objects; i++) {
    searchtet = (triface *) fastlookup(crosstets, i);
    // searchtet is [d,e,a,b].
    eorgoppo(*searchtet, spintet);
    fsym(spintet, neightet); // neightet is [a,b,e,#]
    if (!infected(neightet)) {
      // A top face.
      topfaces->newindex((void **) &parytet);
      *parytet = neightet;
    }
    edestoppo(*searchtet, spintet);
    fsym(spintet, neightet); // neightet is [b,a,d,#]
    if (!infected(neightet)) {
      // A bottom face.
      botfaces->newindex((void **) &parytet);
      *parytet = neightet;
    }
    // Add middle vertices if there are (skip dummypoint).
    pa = org(neightet);
    if (!pinfected(pa)) {
      if (pa != dummypoint) {
        pinfect(pa);
        botpoints->newindex((void **) &parypt);
        *parypt = pa;
        toppoints->newindex((void **) &parypt);
        *parypt = pa;
      }
    }
    pa = dest(neightet);
    if (!pinfected(pa)) {
      if (pa != dummypoint) {
        pinfect(pa);
        botpoints->newindex((void **) &parypt);
        *parypt = pa;
        toppoints->newindex((void **) &parypt);
        *parypt = pa;
      }
    }
  } // i

  // Uninfect all collected top, bottom, and middle vertices.
  for (i = 0; i < toppoints->objects; i++) {
    parypt = (point *) fastlookup(toppoints, i);
    puninfect(*parypt);
  }
  for (i = 0; i < botpoints->objects; i++) {
    parypt = (point *) fastlookup(botpoints, i);
    puninfect(*parypt);
  }
  cavitycount++;

  return true;
}